

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamSequenceDictionary.cpp
# Opt level: O0

bool __thiscall
BamTools::SamSequenceDictionary::Contains(SamSequenceDictionary *this,SamSequence *sequence)

{
  bool bVar1;
  string *in_RDI;
  SamSequenceDictionary *unaff_retaddr;
  
  bVar1 = Contains(unaff_retaddr,in_RDI);
  return bVar1;
}

Assistant:

bool SamSequenceDictionary::Contains(const SamSequence& sequence) const {
    return Contains(sequence.Name);
}